

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_integer
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value)

{
  bool bVar1;
  char *pcVar2;
  int err;
  char *k;
  uint64_t x;
  uint64_t x0;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  k = (char *)0x0;
  ctx_local = (flatcc_json_parser_t *)buf;
  if (buf != end) {
    *value_sign = (uint)(*buf == '-');
    end_local = buf + *value_sign;
    while( true ) {
      bVar1 = false;
      if ((end_local != end) && (bVar1 = false, '/' < *end_local)) {
        bVar1 = *end_local < ':';
      }
      if (!bVar1) {
        if (end_local == buf) {
          return end_local;
        }
        if ((end_local != end) &&
           (((*end_local == 'e' || (*end_local == 'E')) || (*end_local == '.')))) {
          pcVar2 = flatcc_json_parser_set_error(ctx,end_local,end,0xc);
          return pcVar2;
        }
        *value = (uint64_t)k;
        return end_local;
      }
      pcVar2 = (char *)((long)k * 10 + (long)(*end_local + -0x30));
      if (pcVar2 < k) break;
      end_local = end_local + 1;
      k = pcVar2;
    }
    err = 7;
    if (value_sign != (int *)0x0) {
      err = 8;
    }
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,end_local,end,err);
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_integer(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value)
{
    uint64_t x0, x = 0;
    const char *k;

    if (buf == end) {
        return buf;
    }
    k = buf;
    *value_sign = *buf == '-';
    buf += *value_sign;
    while (buf != end && *buf >= '0' && *buf <= '9') {
        x0 = x;
        x = x * 10 + (uint64_t)(*buf - '0');
        if (x0 > x) {
            return flatcc_json_parser_set_error(ctx, buf, end, value_sign ?
                    flatcc_json_parser_error_underflow : flatcc_json_parser_error_overflow);
        }
        ++buf;
    }
    if (buf == k) {
        /* Give up, but don't fail the parse just yet, it might be a valid symbol. */
        return buf;
    }
    if (buf != end && (*buf == 'e' || *buf == 'E' || *buf == '.')) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_float_unexpected);
    }
    *value = x;
    return buf;
}